

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool operator==(char *lhs,ON_String *rhs)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  char *string2;
  
  element_count1 = ON_String::Length(rhs);
  iVar2 = ON_String::Length(lhs);
  if (element_count1 == iVar2) {
    string2 = ON_String::operator_cast_to_char_(rhs);
    bVar1 = ON_String::EqualOrdinal(lhs,element_count1,string2,element_count1,false);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==( const char* lhs, const ON_String& rhs )
{
  const int length = rhs.Length();

  return (length == ON_String::Length(lhs))
    && ON_String::EqualOrdinal(
    lhs,
    length,
    static_cast<const char*>(rhs),
    length,
    false
    );
}